

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_joystick_events.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 uVar1;
  _Bool _Var2;
  ALLEGRO_FONT *pAVar3;
  ALLEGRO_EVENT_QUEUE *pAVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int extraout_EAX;
  uint uVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  ALLEGRO_JOYSTICK *pAVar12;
  ALLEGRO_COLOR *pAVar13;
  char *pcVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  long unaff_RBX;
  int iVar19;
  int iVar20;
  float (*pafVar21) [3];
  ulong uVar22;
  undefined1 *puVar23;
  int iVar24;
  float fVar25;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 uVar26;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 uVar27;
  undefined4 extraout_XMM0_Dd_04;
  float fVar28;
  undefined8 in_XMM1_Qa;
  double dVar29;
  double dVar30;
  float fVar31;
  ulong in_XMM2_Qa;
  undefined8 uVar32;
  double dVar33;
  float fVar34;
  float fVar35;
  undefined1 auStack_268 [192];
  int aiStack_1a8 [32];
  long lStack_128;
  undefined4 local_b8;
  int local_78 [8];
  int local_58;
  int local_54;
  float local_50;
  int local_4c;
  
  cVar5 = al_install_system(0x5020700,atexit);
  if (cVar5 == '\0') {
    pcVar14 = "Could not init Allegro.\n";
  }
  else {
    al_init_primitives_addon();
    al_init_font_addon();
    lVar9 = al_create_display(0x400,0x300);
    if (lVar9 == 0) {
      pcVar14 = "al_create_display failed\n";
    }
    else {
      al_install_keyboard();
      uVar11 = al_map_rgb(0,0,0);
      black.b = (float)in_XMM1_Qa;
      black.r = (float)(int)uVar11;
      black.g = (float)(int)((ulong)uVar11 >> 0x20);
      black.a = SUB84(in_XMM1_Qa,4);
      uVar11 = al_map_rgb(0xe0,0xe0,0xe0);
      grey.b = (float)in_XMM1_Qa;
      grey.r = (float)(int)uVar11;
      grey.g = (float)(int)((ulong)uVar11 >> 0x20);
      grey.a = SUB84(in_XMM1_Qa,4);
      uVar11 = al_map_rgb(0xff,0xff,0xff);
      white.b = (float)in_XMM1_Qa;
      white.r = (float)(int)uVar11;
      white.g = (float)(int)((ulong)uVar11 >> 0x20);
      white.a = SUB84(in_XMM1_Qa,4);
      font = (ALLEGRO_FONT *)al_create_builtin_font();
      al_install_joystick();
      event_queue = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
      if (event_queue != (ALLEGRO_EVENT_QUEUE *)0x0) {
        lVar10 = al_get_keyboard_event_source();
        pAVar4 = event_queue;
        if (lVar10 != 0) {
          uVar11 = al_get_keyboard_event_source();
          al_register_event_source(pAVar4,uVar11);
        }
        pAVar4 = event_queue;
        uVar11 = al_get_display_event_source(lVar9);
        al_register_event_source(pAVar4,uVar11);
        pAVar4 = event_queue;
        uVar11 = al_get_joystick_event_source();
        al_register_event_source(pAVar4,uVar11);
        pAVar12 = (ALLEGRO_JOYSTICK *)al_get_joystick(0);
        setup_joystick_values(pAVar12);
        do {
          cVar5 = al_is_event_queue_empty(event_queue);
          if (cVar5 != '\0') {
            lVar9 = al_get_joystick(0);
            uVar11 = al_get_target_bitmap();
            iVar6 = al_get_bitmap_width(uVar11);
            iVar7 = al_get_bitmap_height(uVar11);
            al_map_rgb(0xff,0xff,0xc0);
            al_clear_to_color();
            pAVar3 = font;
            uVar26 = extraout_XMM0_Dc;
            uVar27 = extraout_XMM0_Dd;
            if (lVar9 != 0) {
              uVar11 = al_get_joystick_name(lVar9);
              in_XMM2_Qa = (ulong)(uint)(float)(iVar6 / 2);
              in_XMM1_Qa = black._8_8_;
              al_draw_textf(black.r,black._8_8_,in_XMM2_Qa,0x41200000,pAVar3,1,"Joystick: %s",uVar11
                           );
              uVar26 = extraout_XMM0_Dc_00;
              uVar27 = extraout_XMM0_Dd_00;
            }
            for (uVar22 = 0; (long)uVar22 < (long)num_sticks; uVar22 = uVar22 + 1) {
              dVar30 = ((double)((uint)uVar22 & 3) + 0.5) * (double)iVar6 * 0.25;
              iVar18 = (int)dVar30;
              dVar29 = (((double)((uint)(uVar22 >> 2) & 0x3fffffff) + 0.5) * (double)iVar7) / 6.0;
              iVar19 = (int)dVar29;
              fVar34 = (float)(int)dVar30;
              uVar16 = CONCAT44((float)(int)(double)CONCAT44(uVar27,uVar26),fVar34);
              iVar20 = (int)(joys[uVar22][0] * 30.0 + fVar34);
              fVar28 = (float)(iVar19 + -0x23);
              fVar34 = joys[uVar22][2];
              fVar35 = (float)(iVar19 + 0x23);
              iVar24 = (int)(joys[uVar22][1] * 30.0 + (float)(int)dVar29);
              al_draw_filled_rectangle
                        ((float)(iVar18 + -0x23),CONCAT44((int)((ulong)dVar29 >> 0x20),fVar28),
                         (float)(iVar18 + 0x23),fVar35,grey._0_8_,grey._8_8_);
              dVar30 = (double)(iVar19 + -0x23) + 0.5;
              uVar11 = CONCAT44((int)((ulong)dVar30 >> 0x20),(float)dVar30);
              dVar30 = (double)(iVar18 + 0x23) + -0.5;
              uVar32 = CONCAT44((int)((ulong)dVar30 >> 0x20),(float)dVar30);
              al_draw_rectangle((float)(iVar18 + -0x23) + 0.5,uVar11,uVar32,
                                (float)(iVar19 + 0x23) + -0.5,black._0_8_,black._8_8_,0);
              in_XMM1_Qa._4_4_ = (float)((ulong)uVar11 >> 0x20);
              in_XMM1_Qa._0_4_ = (float)(iVar24 + -5);
              in_XMM2_Qa = CONCAT44((int)((ulong)uVar32 >> 0x20),(float)(iVar20 + 5));
              al_draw_filled_rectangle
                        ((float)(iVar20 + -5),in_XMM1_Qa,in_XMM2_Qa,(float)(iVar24 + 5),black._0_8_,
                         black._8_8_);
              uVar26 = extraout_XMM0_Dc_01;
              uVar27 = extraout_XMM0_Dd_01;
              if (2 < num_axes[uVar22]) {
                fVar25 = (float)(iVar18 + 0x28);
                fVar31 = (float)(iVar18 + 0x32);
                iVar18 = (int)(fVar34 * 30.0 + (float)(int)dVar29);
                al_draw_filled_rectangle(fVar25,fVar28,fVar31,fVar35,grey._0_8_,grey._8_8_);
                uVar17 = (ulong)(uint)(fVar28 + 0.5);
                al_draw_rectangle(fVar25 + 0.5,uVar17,fVar31 + -0.5,fVar35 + -0.5,black._0_8_,
                                  black._8_8_,0);
                in_XMM1_Qa._4_4_ = (float)(uVar17 >> 0x20);
                in_XMM1_Qa._0_4_ = (float)(iVar18 + -5);
                in_XMM2_Qa = (ulong)(uint)fVar31;
                al_draw_filled_rectangle
                          (fVar25,in_XMM1_Qa,in_XMM2_Qa,(float)(iVar18 + 5),black._0_8_,black._8_8_)
                ;
                uVar26 = extraout_XMM0_Dc_02;
                uVar27 = extraout_XMM0_Dd_02;
              }
              pAVar3 = font;
              if (lVar9 != 0) {
                uVar11 = al_get_joystick_stick_name(lVar9,uVar22 & 0xffffffff);
                in_XMM1_Qa = black._8_8_;
                in_XMM2_Qa = uVar16;
                al_draw_text(black.r,black._8_8_,uVar16,(float)(iVar19 + 0x24),pAVar3,1,uVar11);
                iVar19 = iVar19 + 0x2d;
                uVar26 = extraout_XMM0_Dc_03;
                uVar27 = extraout_XMM0_Dd_03;
                for (iVar18 = 0; pAVar3 = font, iVar18 < num_axes[uVar22]; iVar18 = iVar18 + 1) {
                  uVar11 = al_get_joystick_axis_name(lVar9,uVar22 & 0xffffffff);
                  in_XMM1_Qa = black._8_8_;
                  in_XMM2_Qa = uVar16;
                  al_draw_text(black.r,black._8_8_,uVar16,(float)iVar19,pAVar3,1,uVar11);
                  iVar19 = iVar19 + 10;
                  uVar26 = extraout_XMM0_Dc_04;
                  uVar27 = extraout_XMM0_Dd_04;
                }
              }
            }
            uVar22 = 0;
            while( true ) {
              uVar26 = (undefined4)(in_XMM2_Qa >> 0x20);
              fVar34 = SUB84(in_XMM1_Qa,4);
              if ((long)num_buttons <= (long)uVar22) break;
              _Var2 = joys_buttons[uVar22];
              uVar11 = al_get_target_bitmap();
              iVar6 = al_get_bitmap_width(uVar11);
              iVar20 = ((uint)uVar22 & 7) * 0x1e;
              iVar19 = iVar20 + iVar6 / 2;
              iVar7 = al_get_bitmap_height(uVar11);
              iVar18 = ((uint)(uVar22 >> 3) & 0x1fffffff) * 0x1e;
              iVar24 = iVar18 + iVar7;
              al_draw_filled_rectangle
                        ((float)(iVar19 + -0x78),CONCAT44(fVar34,(float)(iVar24 + -0x78)),
                         CONCAT44(uVar26,(float)(iVar20 + -0x5f + iVar6 / 2)),
                         (float)(iVar18 + -0x5f + iVar7),grey._0_8_,grey._8_8_);
              dVar33 = (double)(iVar19 + -0x78);
              dVar30 = (double)(iVar24 + -0x78);
              dVar29 = dVar30 + 0.5;
              in_XMM1_Qa._4_4_ = (float)((ulong)dVar29 >> 0x20);
              in_XMM1_Qa._0_4_ = (float)dVar29;
              dVar29 = dVar33 + 24.5;
              in_XMM2_Qa = CONCAT44((int)((ulong)dVar29 >> 0x20),(float)dVar29);
              al_draw_rectangle((float)(dVar33 + 0.5),in_XMM1_Qa,in_XMM2_Qa,(float)(dVar30 + 24.5),
                                black._0_8_,black._8_8_,0);
              pAVar13 = &black;
              if (_Var2 == true) {
                in_XMM1_Qa._0_4_ = (float)(iVar24 + -0x76);
                in_XMM2_Qa = CONCAT44((int)(in_XMM2_Qa >> 0x20),(float)(iVar19 + -0x61));
                al_draw_filled_rectangle
                          ((float)(iVar19 + -0x76),in_XMM1_Qa,in_XMM2_Qa,(float)(iVar24 + -0x61),
                           black._0_8_,black._8_8_);
                pAVar13 = &white;
              }
              if (lVar9 != 0) {
                uVar1 = pAVar13->r;
                uVar11._0_4_ = pAVar13->b;
                uVar11._4_4_ = pAVar13->a;
                pcVar14 = (char *)al_get_joystick_button_name(lVar9,uVar22 & 0xffffffff);
                sVar15 = strlen(pcVar14);
                if (sVar15 < 4) {
                  in_XMM2_Qa = CONCAT44((int)(in_XMM2_Qa >> 0x20),(float)(iVar19 + -0x6b));
                  al_draw_text(uVar1,uVar11,in_XMM2_Qa,(float)(iVar24 + -0x70),font,1,pcVar14);
                  in_XMM1_Qa = uVar11;
                }
              }
              uVar22 = uVar22 + 1;
            }
            al_flip_display();
          }
          al_wait_for_event(event_queue,local_78);
          switch(local_78[0]) {
          case 1:
            if (local_54 < 3 && (long)local_58 < 0x10) {
              joys[local_58][local_54] = local_50;
            }
            break;
          case 2:
            joys_buttons[local_4c] = true;
            break;
          case 3:
            joys_buttons[local_4c] = false;
            break;
          case 4:
            al_reconfigure_joysticks();
            pAVar12 = (ALLEGRO_JOYSTICK *)al_get_joystick(0);
            setup_joystick_values(pAVar12);
            break;
          case 5:
          case 6:
          case 7:
          case 8:
          case 9:
            break;
          case 10:
            if (local_58 == 0x3b) goto LAB_00102ca8;
            break;
          default:
            if (local_78[0] == 0x2a) {
LAB_00102ca8:
              al_destroy_font(font);
              return 0;
            }
          }
        } while( true );
      }
      pcVar14 = "al_create_event_queue failed\n";
      event_queue = (ALLEGRO_EVENT_QUEUE *)0x0;
      unaff_RBX = lVar9;
    }
  }
  abort_example(pcVar14);
  if (pcVar14 == (char *)0x0) {
    num_sticks = 0;
    num_buttons = 0;
    return extraout_EAX;
  }
  puVar23 = auStack_268;
  lStack_128 = unaff_RBX;
  al_get_joystick_state();
  iVar6 = al_get_joystick_num_sticks(pcVar14);
  num_sticks = 0x10;
  if (iVar6 < 0x10) {
    num_sticks = iVar6;
  }
  pafVar21 = joys;
  for (uVar22 = 0; (long)uVar22 < (long)num_sticks; uVar22 = uVar22 + 1) {
    uVar8 = al_get_joystick_num_axes(pcVar14,uVar22 & 0xffffffff);
    num_axes[uVar22] = uVar8;
    uVar16 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar16 = 0;
    }
    for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
      (*pafVar21)[uVar17] = *(float *)(puVar23 + uVar17 * 4);
    }
    puVar23 = puVar23 + 0xc;
    pafVar21 = pafVar21 + 1;
  }
  uVar8 = al_get_joystick_num_buttons(pcVar14);
  num_buttons = 0x20;
  if ((int)uVar8 < 0x20) {
    num_buttons = uVar8;
  }
  uVar16 = 0;
  uVar22 = (ulong)(uint)num_buttons;
  if (num_buttons < 1) {
    uVar22 = uVar16;
  }
  for (; uVar22 != uVar16; uVar16 = uVar16 + 1) {
    joys_buttons[uVar16] = 0x3fff < aiStack_1a8[uVar16];
  }
  return (int)uVar16;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   al_init_primitives_addon();
   al_init_font_addon();

   display = al_create_display(1024, 768);
   if (!display) {
      abort_example("al_create_display failed\n");
   }

   al_install_keyboard();

   black = al_map_rgb(0, 0, 0);
   grey = al_map_rgb(0xe0, 0xe0, 0xe0);
   white = al_map_rgb(255, 255, 255);
   font = al_create_builtin_font();

   al_install_joystick();

   event_queue = al_create_event_queue();
   if (!event_queue) {
      abort_example("al_create_event_queue failed\n");
   }

   if (al_get_keyboard_event_source()) {
      al_register_event_source(event_queue, al_get_keyboard_event_source());
   }
   al_register_event_source(event_queue, al_get_display_event_source(display));
   al_register_event_source(event_queue, al_get_joystick_event_source());

   setup_joystick_values(al_get_joystick(0));

   main_loop();

   al_destroy_font(font);

   return 0;
}